

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_compressBlock_btlazy2_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  uint uVar2;
  ZSTD_matchState_t *pZVar3;
  int iVar4;
  undefined8 uVar5;
  uint uVar6;
  size_t sVar7;
  ulong uVar8;
  int *piVar9;
  BYTE *pBVar10;
  BYTE *pBVar11;
  int *piVar12;
  int *piVar13;
  ulong uVar14;
  long lVar15;
  BYTE *pBVar16;
  int *piVar17;
  seqDef *psVar18;
  U32 UVar19;
  uint uVar20;
  size_t offsetFound;
  uint local_cc;
  uint local_bc;
  size_t local_b8;
  size_t local_b0;
  seqStore_t *local_a8;
  int *local_a0;
  uint local_94;
  int *local_90;
  int *local_88;
  int *local_80;
  BYTE *local_78;
  BYTE *local_70;
  BYTE *local_68;
  int *local_60;
  ZSTD_matchState_t *local_58;
  uint *local_50;
  BYTE *local_48;
  int *local_40;
  BYTE *local_38;
  
  local_70 = (ms->window).base;
  uVar2 = (ms->window).dictLimit;
  local_78 = local_70 + uVar2;
  local_cc = *rep;
  pZVar3 = ms->dictMatchState;
  local_80 = (int *)(pZVar3->window).nextSrc;
  local_68 = (pZVar3->window).base;
  local_38 = local_68 + (pZVar3->window).dictLimit;
  uVar6 = ((int)src - ((int)local_78 + (int)local_38)) + (int)local_80;
  local_58 = ms;
  if (uVar6 < local_cc) {
    __assert_fail("offset_1 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x417a,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  piVar17 = (int *)((long)src + (ulong)(uVar6 == 0));
  local_bc = rep[1];
  local_50 = rep;
  if (uVar6 < local_bc) {
    __assert_fail("offset_2 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x417b,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  local_a0 = (int *)((long)src + srcSize);
  local_90 = (int *)((long)src + (srcSize - 8));
  if (piVar17 < local_90) {
    local_94 = ((int)local_68 - (int)local_80) + uVar2;
    local_48 = local_68 + -(ulong)local_94;
    local_40 = local_a0 + -8;
    local_a8 = seqStore;
    do {
      piVar13 = local_a0;
      uVar6 = (((int)piVar17 - (int)local_70) - local_cc) + 1;
      piVar12 = (int *)(local_70 + uVar6);
      if (uVar6 < uVar2) {
        piVar12 = (int *)(local_68 + (uVar6 - local_94));
      }
      if ((uVar6 - uVar2 < 0xfffffffd) && (*piVar12 == *(int *)((long)piVar17 + 1))) {
        piVar9 = local_a0;
        if (uVar6 < uVar2) {
          piVar9 = local_80;
        }
        sVar7 = ZSTD_count_2segments
                          ((BYTE *)((long)piVar17 + 5),(BYTE *)(piVar12 + 1),(BYTE *)local_a0,
                           (BYTE *)piVar9,local_78);
        uVar14 = sVar7 + 4;
      }
      else {
        uVar14 = 0;
      }
      local_b0 = 999999999;
      sVar7 = ZSTD_BtFindBestMatch_dictMatchState_selectMLS
                        (local_58,(BYTE *)piVar17,(BYTE *)piVar13,&local_b0);
      uVar8 = uVar14;
      if (uVar14 < sVar7) {
        uVar8 = sVar7;
      }
      if (uVar8 < 4) {
        piVar17 = (int *)((long)piVar17 + ((long)piVar17 - (long)src >> 8) + 1);
      }
      else {
        local_88 = piVar17;
        local_b8 = local_b0;
        if (sVar7 <= uVar14) {
          local_88 = (int *)((long)piVar17 + 1);
          local_b8 = 0;
        }
        uVar14 = uVar8;
        local_60 = (int *)src;
        if (piVar17 < local_90) {
          do {
            piVar13 = (int *)((long)piVar17 + 1);
            uVar6 = ((int)piVar13 - (int)local_70) - local_cc;
            piVar12 = (int *)(local_70 + uVar6);
            if (uVar6 < uVar2) {
              piVar12 = (int *)(local_68 + (uVar6 - local_94));
            }
            uVar14 = uVar8;
            if ((uVar6 - uVar2 < 0xfffffffd) && (*piVar12 == *piVar13)) {
              piVar9 = local_a0;
              if (uVar6 < uVar2) {
                piVar9 = local_80;
              }
              sVar7 = ZSTD_count_2segments
                                ((BYTE *)((long)piVar17 + 5),(BYTE *)(piVar12 + 1),(BYTE *)local_a0,
                                 (BYTE *)piVar9,local_78);
              uVar6 = (int)local_b8 + 1;
              if (uVar6 == 0) goto LAB_001412b3;
              if (sVar7 < 0xfffffffffffffffc) {
                uVar20 = 0x1f;
                if (uVar6 != 0) {
                  for (; uVar6 >> uVar20 == 0; uVar20 = uVar20 - 1) {
                  }
                }
                if ((int)((uVar20 ^ 0x1f) + (int)uVar8 * 3 + -0x1e) < (int)(sVar7 + 4) * 3) {
                  local_b8 = 0;
                  uVar14 = sVar7 + 4;
                  local_88 = piVar13;
                }
              }
            }
            local_b0 = 999999999;
            uVar8 = ZSTD_BtFindBestMatch_dictMatchState_selectMLS
                              (local_58,(BYTE *)piVar13,(BYTE *)local_a0,&local_b0);
            uVar6 = (int)local_b0 + 1;
            if ((uVar6 == 0) || (uVar20 = (int)local_b8 + 1, uVar20 == 0)) goto LAB_001412b3;
            if (uVar8 < 4) {
LAB_00140dba:
              if (local_90 <= piVar13) break;
              piVar13 = (int *)((long)piVar17 + 2);
              uVar6 = ((int)piVar13 - (int)local_70) - local_cc;
              piVar12 = (int *)(local_70 + uVar6);
              if (uVar6 < uVar2) {
                piVar12 = (int *)(local_68 + (uVar6 - local_94));
              }
              if ((uVar6 - uVar2 < 0xfffffffd) && (*piVar12 == *piVar13)) {
                piVar9 = local_a0;
                if (uVar6 < uVar2) {
                  piVar9 = local_80;
                }
                sVar7 = ZSTD_count_2segments
                                  ((BYTE *)((long)piVar17 + 6),(BYTE *)(piVar12 + 1),
                                   (BYTE *)local_a0,(BYTE *)piVar9,local_78);
                if (sVar7 < 0xfffffffffffffffc) {
                  uVar6 = 0x1f;
                  if (uVar20 != 0) {
                    for (; uVar20 >> uVar6 == 0; uVar6 = uVar6 - 1) {
                    }
                  }
                  if ((int)((uVar6 ^ 0x1f) + (int)uVar14 * 4 + -0x1e) < (int)(sVar7 + 4) * 4) {
                    local_b8 = 0;
                    uVar14 = sVar7 + 4;
                    local_88 = piVar13;
                  }
                }
              }
              local_b0 = 999999999;
              uVar8 = ZSTD_BtFindBestMatch_dictMatchState_selectMLS
                                (local_58,(BYTE *)piVar13,(BYTE *)local_a0,&local_b0);
              uVar6 = (int)local_b0 + 1;
              if ((uVar6 == 0) || (uVar20 = (int)local_b8 + 1, uVar20 == 0)) {
LAB_001412b3:
                __assert_fail("val != 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x12c2,"U32 ZSTD_highbit32(U32)");
              }
              if (uVar8 < 4) break;
              iVar4 = 0x1f;
              if (uVar6 != 0) {
                for (; uVar6 >> iVar4 == 0; iVar4 = iVar4 + -1) {
                }
              }
              uVar6 = 0x1f;
              if (uVar20 != 0) {
                for (; uVar20 >> uVar6 == 0; uVar6 = uVar6 - 1) {
                }
              }
              if ((int)uVar8 * 4 - iVar4 <= (int)((uVar6 ^ 0x1f) + (int)uVar14 * 4 + -0x18)) break;
            }
            else {
              iVar4 = 0x1f;
              if (uVar6 != 0) {
                for (; uVar6 >> iVar4 == 0; iVar4 = iVar4 + -1) {
                }
              }
              uVar6 = 0x1f;
              if (uVar20 != 0) {
                for (; uVar20 >> uVar6 == 0; uVar6 = uVar6 - 1) {
                }
              }
              if ((int)uVar8 * 4 - iVar4 <= (int)((uVar6 ^ 0x1f) + (int)uVar14 * 4 + -0x1b))
              goto LAB_00140dba;
            }
            local_b8 = local_b0;
            uVar14 = uVar8;
            piVar17 = piVar13;
            local_88 = piVar13;
          } while (piVar13 < local_90);
        }
        piVar17 = local_88;
        if (local_b8 == 0) {
          UVar19 = 1;
          uVar6 = local_cc;
        }
        else {
          pBVar10 = (BYTE *)((long)local_88 + (-(long)local_70 - local_b8) + -0xfffffffe);
          pBVar11 = local_70;
          pBVar16 = local_78;
          if ((uint)pBVar10 < uVar2) {
            pBVar11 = local_48;
            pBVar16 = local_38;
          }
          if ((local_60 < local_88) &&
             (uVar8 = (ulong)pBVar10 & 0xffffffff, pBVar16 < pBVar11 + uVar8)) {
            pBVar11 = pBVar11 + uVar8;
            do {
              piVar13 = (int *)((long)piVar17 + -1);
              pBVar11 = pBVar11 + -1;
              if ((*(BYTE *)piVar13 != *pBVar11) ||
                 (uVar14 = uVar14 + 1, piVar17 = piVar13, piVar13 <= local_60)) break;
            } while (pBVar16 < pBVar11);
          }
          UVar19 = (int)local_b8 + 1;
          uVar6 = (int)local_b8 - 2;
          local_bc = local_cc;
        }
        local_cc = uVar6;
        if (local_a8->maxNbSeq <=
            (ulong)((long)local_a8->sequences - (long)local_a8->sequencesStart >> 3)) {
LAB_0014132f:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2038,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < local_a8->maxNbLit) {
LAB_00141310:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203a,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar8 = (long)piVar17 - (long)local_60;
        pBVar16 = local_a8->lit;
        if (local_a8->litStart + local_a8->maxNbLit < pBVar16 + uVar8) {
LAB_001412d2:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_a0 < piVar17) {
LAB_001412f1:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203c,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_40 < piVar17) {
          ZSTD_safecopyLiterals(pBVar16,(BYTE *)local_60,(BYTE *)piVar17,(BYTE *)local_40);
LAB_00140ffa:
          local_a8->lit = local_a8->lit + uVar8;
          if (0xffff < uVar8) {
            if (local_a8->longLengthID != 0) {
              __assert_fail("seqStorePtr->longLengthID == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x204d,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            local_a8->longLengthID = 1;
            local_a8->longLengthPos =
                 (U32)((ulong)((long)local_a8->sequences - (long)local_a8->sequencesStart) >> 3);
          }
        }
        else {
          uVar5 = *(undefined8 *)(local_60 + 2);
          *(undefined8 *)pBVar16 = *(undefined8 *)local_60;
          *(undefined8 *)(pBVar16 + 8) = uVar5;
          pBVar16 = local_a8->lit;
          if (0x10 < uVar8) {
            lVar15 = (long)(pBVar16 + 0x10) - (long)(local_60 + 4);
            if (lVar15 < 8) {
              if (-0x10 < lVar15) {
                __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1268,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
            }
            else if (0xffffffffffffffe0 < lVar15 - 0x10U) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1270,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar5 = *(undefined8 *)(local_60 + 6);
            *(undefined8 *)(pBVar16 + 0x10) = *(undefined8 *)(local_60 + 4);
            *(undefined8 *)(pBVar16 + 0x18) = uVar5;
            if (0x20 < (long)uVar8) {
              lVar15 = 0;
              do {
                puVar1 = (undefined8 *)((long)local_60 + lVar15 + 0x20);
                uVar5 = puVar1[1];
                pBVar11 = pBVar16 + lVar15 + 0x20;
                *(undefined8 *)pBVar11 = *puVar1;
                *(undefined8 *)(pBVar11 + 8) = uVar5;
                puVar1 = (undefined8 *)((long)local_60 + lVar15 + 0x30);
                uVar5 = puVar1[1];
                *(undefined8 *)(pBVar11 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar11 + 0x18) = uVar5;
                lVar15 = lVar15 + 0x20;
              } while (pBVar11 + 0x20 < pBVar16 + uVar8);
            }
            goto LAB_00140ffa;
          }
          local_a8->lit = pBVar16 + uVar8;
        }
        psVar18 = local_a8->sequences;
        psVar18->litLength = (U16)uVar8;
        psVar18->offset = UVar19;
        if (0xffff < uVar14 - 3) {
          if (local_a8->longLengthID != 0) {
LAB_0014134e:
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2058,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_a8->longLengthID = 2;
          local_a8->longLengthPos =
               (U32)((ulong)((long)psVar18 - (long)local_a8->sequencesStart) >> 3);
        }
        psVar18->matchLength = (U16)(uVar14 - 3);
        psVar18 = psVar18 + 1;
        local_a8->sequences = psVar18;
        piVar17 = (int *)((long)piVar17 + uVar14);
        src = piVar17;
        if (piVar17 <= local_90) {
          do {
            uVar6 = local_cc;
            piVar13 = local_a0;
            uVar20 = ((int)piVar17 - (int)local_70) - local_bc;
            pBVar16 = local_70;
            if (uVar20 < uVar2) {
              pBVar16 = local_48;
            }
            src = piVar17;
            local_cc = uVar6;
            if ((0xfffffffc < uVar20 - uVar2) || (*(int *)(pBVar16 + uVar20) != *piVar17)) break;
            piVar12 = local_a0;
            if (uVar20 < uVar2) {
              piVar12 = local_80;
            }
            sVar7 = ZSTD_count_2segments
                              ((BYTE *)(piVar17 + 1),(BYTE *)((long)(pBVar16 + uVar20) + 4),
                               (BYTE *)local_a0,(BYTE *)piVar12,local_78);
            if (local_a8->maxNbSeq <= (ulong)((long)psVar18 - (long)local_a8->sequencesStart >> 3))
            goto LAB_0014132f;
            if (0x20000 < local_a8->maxNbLit) goto LAB_00141310;
            pBVar16 = local_a8->lit;
            if (local_a8->litStart + local_a8->maxNbLit < pBVar16) goto LAB_001412d2;
            if (piVar13 < piVar17) goto LAB_001412f1;
            if (local_40 < piVar17) {
              ZSTD_safecopyLiterals(pBVar16,(BYTE *)piVar17,(BYTE *)piVar17,(BYTE *)local_40);
            }
            else {
              uVar5 = *(undefined8 *)(piVar17 + 2);
              *(undefined8 *)pBVar16 = *(undefined8 *)piVar17;
              *(undefined8 *)(pBVar16 + 8) = uVar5;
            }
            psVar18 = local_a8->sequences;
            psVar18->litLength = 0;
            psVar18->offset = 1;
            if (0xffff < sVar7 + 1) {
              if (local_a8->longLengthID != 0) goto LAB_0014134e;
              local_a8->longLengthID = 2;
              local_a8->longLengthPos =
                   (U32)((ulong)((long)psVar18 - (long)local_a8->sequencesStart) >> 3);
            }
            psVar18->matchLength = (U16)(sVar7 + 1);
            psVar18 = psVar18 + 1;
            local_a8->sequences = psVar18;
            piVar17 = (int *)((long)piVar17 + sVar7 + 4);
            src = piVar17;
            local_cc = local_bc;
            local_bc = uVar6;
          } while (piVar17 <= local_90);
        }
      }
    } while (piVar17 < local_90);
  }
  *local_50 = local_cc;
  local_50[1] = local_bc;
  return (long)local_a0 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_btlazy2_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_binaryTree, 2, ZSTD_dictMatchState);
}